

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_cluster_on_close(intptr_t uuid,fio_protocol_s *pr_)

{
  fio_ls_s *node;
  uint uVar1;
  __pid_t __pid;
  _func_void_intptr_t_fio_protocol_s_ptr *p_Var2;
  fio_sub_hash__ordered_s_ *pos;
  _func_void_intptr_t_fio_protocol_s_ptr *p_Var3;
  fio_lock_i ret;
  
  if (fio_data->is_worker == '\0') {
    fio_lock(&cluster_data.lock);
    node = &cluster_data.clients;
    do {
      node = node->next;
      if (node == &cluster_data.clients) goto LAB_00116684;
    } while (node->obj != (void *)uuid);
    fio_ls_remove(node);
LAB_00116684:
    LOCK();
    cluster_data.lock = '\0';
    UNLOCK();
  }
  else if (((fio_data->active != '\0') && ((int)pr_[3].rsv != 8)) && (fio_data->active != '\0')) {
    if (0 < FIO_LOG_LEVEL) {
      uVar1 = getpid();
      FIO_LOG2STDERR("FATAL: (%d) Parent Process crash detected!",(ulong)uVar1);
    }
    fio_state_callback_force(FIO_CALL_ON_PARENT_CRUSH);
    fio_state_callback_clear(FIO_CALL_ON_PARENT_CRUSH);
    fio_cluster_data_cleanup(1);
    __pid = getpid();
    kill(__pid,2);
  }
  if ((fio_msg_internal_s *)pr_[1].on_data != (fio_msg_internal_s *)0x0) {
    fio_msg_internal_free((fio_msg_internal_s *)pr_[1].on_data);
  }
  pr_[1].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  p_Var3 = pr_[2].on_data;
  if (pr_[1].rsv != 0 && p_Var3 != (_func_void_intptr_t_fio_protocol_s_ptr *)0x0) {
    p_Var2 = p_Var3 + pr_[1].rsv * 0x40;
    for (; p_Var3 < p_Var2; p_Var3 = p_Var3 + 0x40) {
      if (*(long *)p_Var3 != 0) {
        fio_str_free((fio_str_s *)(p_Var3 + 8));
        fio_unsubscribe(*(subscription_s **)(p_Var3 + 0x38));
      }
    }
  }
  fio_free(pr_[2].on_ready);
  fio_free(pr_[2].on_data);
  pr_[2].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  pr_[2].on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0;
  pr_[1].rsv = 0;
  pr_[2].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  pr_[1].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  pr_[1].ping = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  fio_free(pr_);
  return;
}

Assistant:

static void fio_cluster_on_close(intptr_t uuid, fio_protocol_s *pr_) {
  cluster_pr_s *c = (cluster_pr_s *)pr_;
  if (!fio_data->is_worker) {
    /* a child was lost, respawning is handled elsewhere. */
    fio_lock(&cluster_data.lock);
    FIO_LS_FOR(&cluster_data.clients, pos) {
      if (pos->obj == (void *)uuid) {
        fio_ls_remove(pos);
        break;
      }
    }
    fio_unlock(&cluster_data.lock);
  } else if (fio_data->active) {
    /* no shutdown message received - parent crashed. */
    if (c->type != FIO_CLUSTER_MSG_SHUTDOWN && fio_is_running()) {
      FIO_LOG_FATAL("(%d) Parent Process crash detected!", (int)getpid());
      fio_state_callback_force(FIO_CALL_ON_PARENT_CRUSH);
      fio_state_callback_clear(FIO_CALL_ON_PARENT_CRUSH);
      fio_cluster_data_cleanup(1);
      kill(getpid(), SIGINT);
    }
  }
  if (c->msg)
    fio_msg_internal_free(c->msg);
  c->msg = NULL;
  fio_sub_hash_free(&c->pubsub);
  fio_cluster_protocol_free(c);
  (void)uuid;
}